

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddUserItem
          (cmComputeLinkInformation *this,LinkEntry *entry,bool pathNotKnown)

{
  RegularExpression *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte *string;
  char *pcVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string lib;
  string out;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_140;
  size_type local_110;
  pointer local_108;
  undefined8 local_100;
  element_type *local_f8;
  pointer local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 auStack_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  long local_48;
  _Alloc_hider _Stack_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  string = (byte *)(entry->Item).Value._M_dataplus._M_p;
  if ((*string - 0x24 < 0x3d) &&
     ((0x1000000000000201U >> ((ulong)(*string - 0x24) & 0x3f) & 1) != 0)) {
    local_140.Value._M_dataplus._M_p = (pointer)(entry->Item).Value._M_string_length;
    __str._M_str = "-l";
    __str._M_len = 2;
    local_140.Value._M_string_length = (size_type)string;
    iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_140,0,2,__str);
    if (iVar5 != 0) {
      local_140.Value._M_string_length = (size_type)(entry->Item).Value._M_dataplus._M_p;
      local_140.Value._M_dataplus._M_p = (pointer)(entry->Item).Value._M_string_length;
      __str_00._M_str = "-Wl,-l";
      __str_00._M_len = 6;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_140,0,6,__str_00
                        );
      if (iVar5 != 0) goto LAB_004d472f;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OldUserFlagItems,(value_type *)entry);
LAB_004d472f:
    SetCurrentLinkType(this,this->StartLinkType);
    local_140.Value._M_dataplus._M_p = local_140.Value._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&entry->Item,(ItemIsPath *)&local_140);
    return;
  }
  local_f0 = (pointer)0x0;
  local_e8[0] = 0;
  local_f8 = (element_type *)local_e8;
  bVar4 = cmsys::RegularExpression::find
                    (&this->ExtractSharedLibraryName,(char *)string,
                     &(this->ExtractSharedLibraryName).regmatch);
  if (bVar4) {
    SetCurrentLinkType(this,LinkShared);
    pcVar3 = (this->ExtractSharedLibraryName).regmatch.startp[2];
    if (pcVar3 == (char *)0x0) {
LAB_004d4811:
      local_140.Value._M_dataplus._M_p = (pointer)&local_140.Value.field_2;
      local_140.Value._M_string_length = 0;
      local_140.Value.field_2._M_allocated_capacity =
           local_140.Value.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
    else {
      local_140.Value._M_dataplus._M_p = (pointer)&local_140.Value.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,pcVar3,(this->ExtractSharedLibraryName).regmatch.endp[2]);
    }
LAB_004d4864:
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.Value._M_dataplus._M_p != &local_140.Value.field_2) {
      operator_delete(local_140.Value._M_dataplus._M_p,
                      local_140.Value.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = cmsys::RegularExpression::find
                      (&this->ExtractStaticLibraryName,(entry->Item).Value._M_dataplus._M_p,
                       &(this->ExtractStaticLibraryName).regmatch);
    if (bVar4) {
      SetCurrentLinkType(this,LinkStatic);
      pcVar3 = (this->ExtractStaticLibraryName).regmatch.startp[2];
      if (pcVar3 == (char *)0x0) goto LAB_004d4811;
      local_140.Value._M_dataplus._M_p = (pointer)&local_140.Value.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,pcVar3,(this->ExtractStaticLibraryName).regmatch.endp[2]);
      goto LAB_004d4864;
    }
    this_00 = &this->ExtractAnyLibraryName;
    bVar4 = cmsys::RegularExpression::find
                      (this_00,(entry->Item).Value._M_dataplus._M_p,&this_00->regmatch);
    if (bVar4) {
      SetCurrentLinkType(this,this->StartLinkType);
      cmsys::RegularExpression::match_abi_cxx11_(&local_140.Value,this_00,2);
      goto LAB_004d4864;
    }
    if (pathNotKnown) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldUserFlagItems,(value_type *)entry);
    }
    SetCurrentLinkType(this,this->StartLinkType);
    std::__cxx11::string::_M_assign((string *)&local_f8);
  }
  local_140.Value._M_string_length = (size_type)(this->LibLinkFlag)._M_dataplus._M_p;
  local_140.Value._M_dataplus._M_p = (pointer)(this->LibLinkFlag)._M_string_length;
  local_140.Value.field_2._M_allocated_capacity = 0;
  local_140.Value.field_2._8_8_ = local_f0;
  local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_f8;
  local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = (this->LibLinkSuffix)._M_dataplus._M_p;
  local_110 = (this->LibLinkSuffix)._M_string_length;
  local_100 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_140;
  cmCatViews((string *)(auStack_a0 + 8),views);
  __n = (entry->Feature)._M_string_length;
  if ((__n == (anonymous_namespace)::DEFAULT_abi_cxx11_[1]) &&
     ((__n == 0 ||
      (iVar5 = bcmp((entry->Feature)._M_dataplus._M_p,
                    (void *)*(anonymous_namespace)::DEFAULT_abi_cxx11_,__n), iVar5 == 0)))) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_e8 + 0x20);
    local_d8._M_allocated_capacity = (size_type)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_e8 + 0x10),auStack_a0._8_8_,
               (undefined1 *)(auStack_a0._8_8_ + auStack_a0._16_8_));
    local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
         .
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    paVar1 = &local_140.Value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_allocated_capacity == paVar2) {
      local_140.Value.field_2._8_8_ = local_c8._8_8_;
      local_140.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.Value._M_dataplus._M_p = (pointer)local_d8._M_allocated_capacity;
    }
    local_140.Value.field_2._M_allocated_capacity._1_7_ = local_c8._1_7_;
    local_140.Value.field_2._M_local_buf[0] = local_c8[0];
    local_140.Value._M_string_length = local_d8._8_8_;
    local_d8._8_8_ = (element_type *)0x0;
    local_c8[0] = 0;
    local_58._M_allocated_capacity = (ulong)(uint)local_58._M_allocated_capacity._4_4_ << 0x20;
    local_d8._M_allocated_capacity = (size_type)paVar2;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_140,(ItemIsPath *)&local_58._M_allocated_capacity);
    if (local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_140.Value._M_dataplus._M_p,
                      local_140.Value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_allocated_capacity == paVar2) goto LAB_004d4bfc;
    local_78._16_8_ = CONCAT71(local_c8._1_7_,local_c8[0]);
    local_78._0_8_ = local_d8._M_allocated_capacity;
  }
  else {
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,&entry->Feature);
    local_140.Value._M_dataplus._M_p = local_f0;
    local_140.Value._M_string_length = (size_type)local_f8;
    local_140.Value.field_2._M_allocated_capacity = 0;
    local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(this->LibLinkSuffix)._M_dataplus._M_p;
    local_140.Value.field_2._8_8_ = (this->LibLinkSuffix)._M_string_length;
    local_140.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_140;
    cmCatViews((string *)local_78,views_00);
    FeatureDescriptor::GetDecoratedItem
              ((string *)&local_b8,(FeatureDescriptor *)(cVar6._M_node + 2),(string *)local_78,
               (string *)entry,(string *)(auStack_a0 + 8),No);
    local_38 = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_30 = (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_30->_M_use_count = local_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_30->_M_use_count = local_30->_M_use_count + 1;
      }
    }
    if ((undefined1 *)local_b8._M_allocated_capacity == &local_a8) {
      _Stack_40._M_p = (pointer)auStack_a0._0_8_;
      local_58._M_allocated_capacity = (size_type)&local_48;
    }
    else {
      local_58._M_allocated_capacity = local_b8._M_allocated_capacity;
    }
    local_48 = CONCAT71(uStack_a7,local_a8);
    local_58._8_8_ = local_b8._8_8_;
    local_b8._8_8_ = 0;
    local_a8 = 0;
    local_140.Value._M_dataplus._M_p = local_140.Value._M_dataplus._M_p & 0xffffffff00000000;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,(ItemIsPath *)&local_140);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if ((long *)local_58._M_allocated_capacity != &local_48) {
      operator_delete((void *)local_58._M_allocated_capacity,local_48 + 1);
    }
    if ((undefined1 *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,CONCAT71(uStack_a7,local_a8) + 1);
    }
    if ((element_type *)local_78._0_8_ == (element_type *)(local_78 + 0x10)) goto LAB_004d4bfc;
  }
  operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
LAB_004d4bfc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_a0._8_8_ != &local_88) {
    operator_delete((void *)auStack_a0._8_8_,local_88._M_allocated_capacity + 1);
  }
  if (local_f8 == (element_type *)local_e8) {
    return;
  }
  operator_delete(local_f8,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
  return;
}

Assistant:

void cmComputeLinkInformation::AddUserItem(LinkEntry const& entry,
                                           bool pathNotKnown)
{
  // This is called to handle a link item that does not match a CMake
  // target and is not a full path.  We check here if it looks like a
  // library file name to automatically request the proper link type
  // from the linker.  For example:
  //
  //   foo       ==>  -lfoo
  //   libfoo.a  ==>  -Wl,-Bstatic -lfoo

  BT<std::string> const& item = entry.Item;

  if (item.Value[0] == '-' || item.Value[0] == '$' || item.Value[0] == '`') {
    // Pass flags through untouched.
    // if this is a -l option then we might need to warn about
    // CMP0003 so put it in OldUserFlagItems, if it is not a -l
    // or -Wl,-l (-framework -pthread), then allow it without a
    // CMP0003 as -L will not affect those other linker flags
    if (cmHasLiteralPrefix(item.Value, "-l") ||
        cmHasLiteralPrefix(item.Value, "-Wl,-l")) {
      // This is a linker option provided by the user.
      this->OldUserFlagItems.push_back(item.Value);
    }

    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use the item verbatim.
    this->Items.emplace_back(item, ItemIsPath::No);
    return;
  }

  // Parse out the prefix, base, and suffix components of the
  // library name.  If the name matches that of a shared or static
  // library then set the link type accordingly.
  //
  // Search for shared library names first because some platforms
  // have shared libraries with names that match the static library
  // pattern.  For example cygwin and msys use the convention
  // libfoo.dll.a for import libraries and libfoo.a for static
  // libraries.  On AIX a library with the name libfoo.a can be
  // shared!
  std::string lib;
  if (this->ExtractSharedLibraryName.find(item.Value)) {
// This matches a shared library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex matched [%s] [%s] [%s]\n",
            this->ExtractSharedLibraryName.match(1).c_str(),
            this->ExtractSharedLibraryName.match(2).c_str(),
            this->ExtractSharedLibraryName.match(3).c_str());
#endif
    // Set the link type to shared.
    this->SetCurrentLinkType(LinkShared);

    // Use just the library name so the linker will search.
    lib = this->ExtractSharedLibraryName.match(2);
  } else if (this->ExtractStaticLibraryName.find(item.Value)) {
// This matches a static library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex matched [%s] [%s] [%s]\n",
            this->ExtractStaticLibraryName.match(1).c_str(),
            this->ExtractStaticLibraryName.match(2).c_str(),
            this->ExtractStaticLibraryName.match(3).c_str());
#endif
    // Set the link type to static.
    this->SetCurrentLinkType(LinkStatic);

    // Use just the library name so the linker will search.
    lib = this->ExtractStaticLibraryName.match(2);
  } else if (this->ExtractAnyLibraryName.find(item.Value)) {
// This matches a library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "any regex matched [%s] [%s] [%s]\n",
            this->ExtractAnyLibraryName.match(1).c_str(),
            this->ExtractAnyLibraryName.match(2).c_str(),
            this->ExtractAnyLibraryName.match(3).c_str());
#endif
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use just the library name so the linker will search.
    lib = this->ExtractAnyLibraryName.match(2);
  } else {
    // This is a name specified by the user.
    if (pathNotKnown) {
      this->OldUserFlagItems.push_back(item.Value);
    }

    // We must ask the linker to search for a library with this name.
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);
    lib = item.Value;
  }

  // Create an option to ask the linker to search for the library.
  auto out = cmStrCat(this->LibLinkFlag, lib, this->LibLinkSuffix);

  if (entry.Feature != DEFAULT) {
    auto const& feature = this->GetLibraryFeature(entry.Feature);
    this->Items.emplace_back(
      BT<std::string>(
        feature.GetDecoratedItem(cmStrCat(lib, this->LibLinkSuffix),
                                 item.Value, out, ItemIsPath::No),
        item.Backtrace),
      ItemIsPath::No);
  } else {
    this->Items.emplace_back(BT<std::string>(out, item.Backtrace),
                             ItemIsPath::No);
  }

  // Here we could try to find the library the linker will find and
  // add a runtime information entry for it.  It would probably not be
  // reliable and we want to encourage use of full paths for library
  // specification.
}